

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

bool testing::internal::ShouldUseColor(bool stdout_is_tty)

{
  bool bVar1;
  char *__s;
  bool bVar2;
  bool bVar3;
  bool local_e5;
  bool local_e3;
  bool local_c2;
  bool local_c1;
  allocator<char> local_a1;
  string local_a0;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78;
  undefined1 local_51;
  char *pcStack_50;
  bool term_supports_color;
  char *term;
  char *local_38;
  char *gtest_color;
  string c;
  bool stdout_is_tty_local;
  
  c.field_2._M_local_buf[0xe] = stdout_is_tty;
  std::__cxx11::string::string((string *)&gtest_color,(string *)FLAGS_gtest_color_abi_cxx11_);
  local_38 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &gtest_color);
  bVar2 = String::CaseInsensitiveCStringEquals(local_38,"auto");
  if (bVar2) {
    pcStack_50 = posix::GetEnv("TERM");
    local_7a = 0;
    local_7b = 0;
    bVar1 = false;
    bVar2 = false;
    local_c1 = false;
    if (pcStack_50 != (char *)0x0) {
      bVar3 = String::CStringEquals(pcStack_50,"xterm");
      local_c2 = true;
      if (!bVar3) {
        bVar3 = String::CStringEquals(pcStack_50,"xterm-color");
        local_c2 = true;
        if (!bVar3) {
          bVar3 = String::CStringEquals(pcStack_50,"xterm-kitty");
          local_c2 = true;
          if (!bVar3) {
            bVar3 = String::CStringEquals(pcStack_50,"alacritty");
            local_c2 = true;
            if (!bVar3) {
              bVar3 = String::CStringEquals(pcStack_50,"screen");
              local_c2 = true;
              if (!bVar3) {
                bVar3 = String::CStringEquals(pcStack_50,"tmux");
                local_c2 = true;
                if (!bVar3) {
                  bVar3 = String::CStringEquals(pcStack_50,"rxvt-unicode");
                  local_c2 = true;
                  if (!bVar3) {
                    bVar3 = String::CStringEquals(pcStack_50,"linux");
                    local_c2 = true;
                    if (!bVar3) {
                      bVar3 = String::CStringEquals(pcStack_50,"cygwin");
                      __s = pcStack_50;
                      local_c2 = true;
                      if (!bVar3) {
                        std::allocator<char>::allocator();
                        local_7a = 1;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_78,__s,&local_79);
                        local_7b = 1;
                        std::allocator<char>::allocator();
                        bVar1 = true;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_a0,"-256color",&local_a1);
                        bVar2 = true;
                        local_c2 = String::EndsWithCaseInsensitive(&local_78,&local_a0);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_c1 = local_c2;
    }
    if (bVar2) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    if (bVar1) {
      std::allocator<char>::~allocator(&local_a1);
    }
    if ((local_7b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_78);
    }
    if ((local_7a & 1) != 0) {
      std::allocator<char>::~allocator(&local_79);
    }
    local_51 = local_c1;
    local_e3 = false;
    if ((c.field_2._M_local_buf[0xe] & 1U) != 0) {
      local_e3 = (bool)local_51;
    }
    c.field_2._M_local_buf[0xf] = local_e3;
  }
  else {
    bVar2 = String::CaseInsensitiveCStringEquals(local_38,"yes");
    local_e5 = true;
    if (!bVar2) {
      bVar2 = String::CaseInsensitiveCStringEquals(local_38,"true");
      local_e5 = true;
      if (!bVar2) {
        bVar2 = String::CaseInsensitiveCStringEquals(local_38,"t");
        local_e5 = true;
        if (!bVar2) {
          local_e5 = String::CStringEquals(local_38,"1");
        }
      }
    }
    c.field_2._M_local_buf[0xf] = local_e5;
  }
  std::__cxx11::string::~string((string *)&gtest_color);
  return (bool)(c.field_2._M_local_buf[0xf] & 1);
}

Assistant:

bool ShouldUseColor(bool stdout_is_tty) {
  std::string c = GTEST_FLAG_GET(color);
  const char* const gtest_color = c.c_str();

  if (String::CaseInsensitiveCStringEquals(gtest_color, "auto")) {
#if defined(GTEST_OS_WINDOWS) && !defined(GTEST_OS_WINDOWS_MINGW)
    // On Windows the TERM variable is usually not set, but the
    // console there does support colors.
    return stdout_is_tty;
#else
    // On non-Windows platforms, we rely on the TERM variable.
    const char* const term = posix::GetEnv("TERM");
    const bool term_supports_color =
        term != nullptr && (String::CStringEquals(term, "xterm") ||
                            String::CStringEquals(term, "xterm-color") ||
                            String::CStringEquals(term, "xterm-kitty") ||
                            String::CStringEquals(term, "alacritty") ||
                            String::CStringEquals(term, "screen") ||
                            String::CStringEquals(term, "tmux") ||
                            String::CStringEquals(term, "rxvt-unicode") ||
                            String::CStringEquals(term, "linux") ||
                            String::CStringEquals(term, "cygwin") ||
                            String::EndsWithCaseInsensitive(term, "-256color"));
    return stdout_is_tty && term_supports_color;
#endif  // GTEST_OS_WINDOWS
  }

  return String::CaseInsensitiveCStringEquals(gtest_color, "yes") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "true") ||
         String::CaseInsensitiveCStringEquals(gtest_color, "t") ||
         String::CStringEquals(gtest_color, "1");
  // We take "yes", "true", "t", and "1" as meaning "yes".  If the
  // value is neither one of these nor "auto", we treat it as "no" to
  // be conservative.
}